

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCatalog.h
# Opt level: O2

void __thiscall psy::C::NameCatalog::NameCatalog(NameCatalog *this)

{
  std::
  stack<psy::C::SyntaxNode_const*,std::deque<psy::C::SyntaxNode_const*,std::allocator<psy::C::SyntaxNode_const*>>>
  ::stack<std::deque<psy::C::SyntaxNode_const*,std::allocator<psy::C::SyntaxNode_const*>>,void>
            (&this->enclosureStack_);
  (this->enclosureIdx_)._M_h._M_buckets = &(this->enclosureIdx_)._M_h._M_single_bucket;
  (this->enclosureIdx_)._M_h._M_bucket_count = 1;
  (this->enclosureIdx_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->enclosureIdx_)._M_h._M_element_count = 0;
  (this->enclosureIdx_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->enclosureIdx_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->enclosureIdx_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

class PSY_C_INTERNAL_API NameCatalog
{
    friend std::ostream& operator<<(std::ostream& os, const NameCatalog& disambigCatalog);

public:
    ~NameCatalog();

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(NameCataloger);
    PSY_GRANT_INTERNAL_ACCESS(SyntaxCorrelationDisambiguator);

    void indexNodeAndMarkAsEncloser(const SyntaxNode* node);
    void markIndexedNodeAsEncloser(const SyntaxNode* node);
    void dropEncloser();

    void catalogUseAsTypeName(const std::string& name);
    void catalogUseAsNonTypeName(const std::string& name);
    void catalogDefAsTypeName(const std::string& name);
    void catalogDefAsNonTypeName(const std::string& name);

    bool hasUseAsTypeName(const std::string& name) const;
    bool hasUseAsNonTypeName(const std::string& name) const;
    bool hasDefAsTypeName(const std::string& name) const;
    bool hasDefAsNonTypeName(const std::string& name) const;

private:
    using NameUseAndDef = std::unordered_map<std::string, std::pair<bool, size_t>>;
    using Enclosure = std::tuple<NameUseAndDef, NameUseAndDef>;
    using EnclosureIndex = std::unordered_map<const SyntaxNode*, Enclosure>;

    static constexpr int Types = 0;
    static constexpr int NonTypes = 1;

    std::stack<const SyntaxNode*> enclosureStack_;
    mutable EnclosureIndex enclosureIdx_;

    Enclosure* currentEnclosure() const;

    bool isIndexed(const SyntaxNode* node) const;

    template <size_t, size_t> void catalogUse_CORE(const std::string& name);
    template <size_t> void catalogDef_CORE(const std::string& name);
    template <size_t> bool hasUseAs_CORE(const std::string& name) const;
    template <size_t> bool hasDefAs_CORE(const std::string& name) const;
}